

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool_block.cpp
# Opt level: O2

shared_ptr<cppnet::BlockMemoryPool>
cppnet::MakeBlockMemoryPoolPtr(uint32_t large_sz,uint32_t add_num)

{
  element_type *in_RDI;
  shared_ptr<cppnet::BlockMemoryPool> sVar1;
  uint local_c;
  
  sVar1 = std::make_shared<cppnet::BlockMemoryPool,unsigned_int&,unsigned_int&>
                    ((uint *)in_RDI,&local_c);
  sVar1.super___shared_ptr<cppnet::BlockMemoryPool,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<cppnet::BlockMemoryPool>)
         sVar1.super___shared_ptr<cppnet::BlockMemoryPool,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<BlockMemoryPool> MakeBlockMemoryPoolPtr(uint32_t large_sz, uint32_t add_num) {
    return std::make_shared<BlockMemoryPool>(large_sz, add_num);
}